

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

void cf_sha512_init(cf_sha512_context *ctx)

{
  memset(ctx->partial,0,0x90);
  ctx->H[0] = 0x6a09e667f3bcc908;
  ctx->H[1] = 0xbb67ae8584caa73b;
  ctx->H[2] = 0x3c6ef372fe94f82b;
  ctx->H[3] = 0xa54ff53a5f1d36f1;
  ctx->H[4] = 0x510e527fade682d1;
  ctx->H[5] = 0x9b05688c2b3e6c1f;
  ctx->H[6] = 0x1f83d9abfb41bd6b;
  ctx->H[7] = 0x5be0cd19137e2179;
  return;
}

Assistant:

void cf_sha512_init(cf_sha512_context *ctx)
{
  memset(ctx, 0, sizeof *ctx);
  ctx->H[0] = UINT64_C(0x6a09e667f3bcc908);
  ctx->H[1] = UINT64_C(0xbb67ae8584caa73b);
  ctx->H[2] = UINT64_C(0x3c6ef372fe94f82b);
  ctx->H[3] = UINT64_C(0xa54ff53a5f1d36f1);
  ctx->H[4] = UINT64_C(0x510e527fade682d1);
  ctx->H[5] = UINT64_C(0x9b05688c2b3e6c1f);
  ctx->H[6] = UINT64_C(0x1f83d9abfb41bd6b);
  ctx->H[7] = UINT64_C(0x5be0cd19137e2179);
}